

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_personality.c
# Opt level: O2

id objc_begin_catch(_Unwind_Exception *exceptionObject)

{
  undefined4 *puVar1;
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  id poVar5;
  Class receiver;
  SEL selector;
  IMP p_Var6;
  _Unwind_Exception *p_Var7;
  
  lVar4 = __tls_get_addr(&PTR_00129e08);
  puVar1 = (undefined4 *)(lVar4 + 0x48);
  *(undefined1 *)(lVar4 + 0x4c) = 0;
  uVar3 = exceptionObject->exception_class;
  if (uVar3 == 0x474e55434f424a43) {
    *puVar1 = 2;
    iVar2 = (int)exceptionObject[-1].private_2;
    if (iVar2 == 0) {
      *(undefined4 *)&exceptionObject[-1].private_2 = 1;
      exceptionObject[-1].private_1 = *(uintptr_t *)(lVar4 + 0x50);
      *(_Unwind_Exception **)(lVar4 + 0x50) = exceptionObject + -1;
    }
    else if (iVar2 < 0) {
      *(int *)&exceptionObject[-1].private_2 = 1 - iVar2;
    }
    else {
      *(int *)&exceptionObject[-1].private_2 = iVar2 + 1;
    }
    p_Var7 = (_Unwind_Exception *)exceptionObject[1].exception_class;
  }
  else {
    if (*(long *)(lVar4 + 0x50) != 0) {
      abort();
    }
    if (uVar3 == cxx_exception_class) {
      *puVar1 = 1;
      poVar5 = (id)__cxa_begin_catch(exceptionObject);
      return poVar5;
    }
    if (_objc_class_for_boxing_foreign_exception != (_func_Class_int64_t *)0x0) {
      receiver = (*_objc_class_for_boxing_foreign_exception)(uVar3);
      selector = sel_registerName("exceptionWithForeignException:");
      p_Var6 = objc_msg_lookup((id)receiver,selector);
      if (p_Var6 != (IMP)0x0) {
        poVar5 = (*p_Var6)((id)receiver,selector,exceptionObject);
        *(id *)(lVar4 + 0x50) = poVar5;
        *puVar1 = 4;
        return poVar5;
      }
    }
    *puVar1 = 3;
    *(_Unwind_Exception **)(lVar4 + 0x50) = exceptionObject;
    p_Var7 = exceptionObject + 1;
  }
  return (id)p_Var7;
}

Assistant:

OBJC_PUBLIC id objc_begin_catch(struct _Unwind_Exception *exceptionObject)
{
	struct thread_data *td = get_thread_data();
	DEBUG_LOG("Beginning catch %p\n", exceptionObject);
	td->cxxCaughtException = NO;
	if (exceptionObject->exception_class == objc_exception_class)
	{
		td->current_exception_type = OBJC;
		struct objc_exception *ex = objc_exception_from_header(exceptionObject);
		if (ex->catch_count == 0)
		{
			// If this is the first catch, add it to the list.
			ex->catch_count = 1;
			ex->next = td->caughtExceptions;
			td->caughtExceptions = ex;
		}
		else if (ex->catch_count < 0)
		{
			// If this is being thrown, mark it as caught again and increment
			// the refcount
			ex->catch_count = -ex->catch_count + 1;
		}
		else
		{
			// Otherwise, just increment the catch count
			ex->catch_count++;
		}
		DEBUG_LOG("objc catch\n");
		return ex->object;
	}
	// If we have a foreign exception while we have stacked exceptions, we have
	// a problem.  We can't chain them, so we follow the example of C++ and
	// just abort.
	if (td->caughtExceptions != 0)
	{
		// FIXME: Actually, we can handle a C++ exception if only ObjC
		// exceptions are in-flight
		abort();
	}
#ifndef NO_OBJCXX
	// If this is a C++ exception, let the C++ runtime handle it.
	if (exceptionObject->exception_class == cxx_exception_class)
	{
		DEBUG_LOG("c++ catch\n");
		td->current_exception_type = CXX;
		return __cxa_begin_catch(exceptionObject);
	}
#endif
	DEBUG_LOG("foreign exception catch\n");
	// Box if we have a boxing function.
	if (_objc_class_for_boxing_foreign_exception)
	{
		Class thrown_class =
			_objc_class_for_boxing_foreign_exception(exceptionObject->exception_class);
		SEL box_sel = sel_registerName("exceptionWithForeignException:");
		id(*boxfunction)(Class,SEL,struct _Unwind_Exception*) = 
			(id(*)(Class,SEL,struct _Unwind_Exception*))objc_msg_lookup((id)thrown_class, box_sel);
		if (boxfunction != 0)
		{
			id boxed = boxfunction(thrown_class, box_sel, exceptionObject);
			td->caughtExceptions = (struct objc_exception*)boxed;
			td->current_exception_type = BOXED_FOREIGN;
			return boxed;
		}
	}
	td->current_exception_type = FOREIGN;
	td->caughtExceptions = (struct objc_exception*)exceptionObject;
	// If this is some other kind of exception, then assume that the value is
	// at the end of the exception header.
	return (id)((char*)exceptionObject + sizeof(struct _Unwind_Exception));
}